

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

void protozero::add_varint_to_buffer<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *buffer,
               uint64_t value)

{
  undefined8 local_18;
  uint64_t value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *buffer_local;
  
  for (local_18 = value; 0x7f < local_18; local_18 = local_18 >> 7) {
    buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::push_back(buffer,(byte)local_18 & 0x7f | 0x80);
  }
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::push_back(buffer,(byte)local_18);
  return;
}

Assistant:

inline void add_varint_to_buffer(TBuffer* buffer, uint64_t value) {
    while (value >= 0x80U) {
        buffer_customization<TBuffer>::push_back(buffer, static_cast<char>((value & 0x7fU) | 0x80U));
        value >>= 7U;
    }
    buffer_customization<TBuffer>::push_back(buffer, static_cast<char>(value));
}